

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsEarlyFragmentTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::FragmentOperations::anon_unknown_1::EarlyFragmentTest::createInstance
          (EarlyFragmentTest *this,Context *context)

{
  uint uVar1;
  InstanceInterface *pIVar2;
  VkPhysicalDevice pVVar3;
  TestInstance *pTVar4;
  NotSupportedError *this_00;
  uint uVar5;
  VkPhysicalDeviceFeatures features;
  string local_128;
  undefined1 local_104 [104];
  int local_9c;
  
  pIVar2 = Context::getInstanceInterface(context);
  pVVar3 = Context::getPhysicalDevice(context);
  (*pIVar2->_vptr_InstanceInterface[2])(pIVar2,pVVar3,local_104);
  if (local_9c != 0) {
    pTVar4 = (TestInstance *)operator_new(0x18);
    uVar1 = this->m_flags;
    pTVar4->m_context = context;
    pTVar4->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00d31490;
    uVar5 = 1;
    if ((uVar1 & 1) == 0) {
      uVar5 = uVar1 & 2;
    }
    *(uint *)&pTVar4[1]._vptr_TestInstance = uVar5;
    *(bool *)((long)&pTVar4[1]._vptr_TestInstance + 4) = (uVar1 & 4) == 0;
    *(bool *)((long)&pTVar4[1]._vptr_TestInstance + 5) = (uVar1 & 8) == 0;
    return pTVar4;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"Missing required feature: fragmentStoresAndAtomics","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_128);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* EarlyFragmentTest::createInstance (Context& context) const
{
	// Check required features
	{
		VkPhysicalDeviceFeatures features;
		context.getInstanceInterface().getPhysicalDeviceFeatures(context.getPhysicalDevice(), &features);

		// SSBO writes in fragment shader
		if (!features.fragmentStoresAndAtomics)
			throw tcu::NotSupportedError("Missing required feature: fragmentStoresAndAtomics");
	}

	return new EarlyFragmentTestInstance(context, m_flags);
}